

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::MILSpec::Value::Value(Value *this,Value *from)

{
  bool bVar1;
  ValueCase VVar2;
  string *psVar3;
  ulong uVar4;
  Arena *pAVar5;
  ValueType *this_00;
  Value_ImmediateValue *this_01;
  Value_ImmediateValue *from_00;
  Value_BlobFileValue *this_02;
  Value_BlobFileValue *from_01;
  Value *from_local;
  Value *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Value_006f0598;
  ValueUnion::ValueUnion((ValueUnion *)&this->value_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->docstring_,psVar3);
  _internal_docstring_abi_cxx11_(from);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar3 = _internal_docstring_abi_cxx11_(from);
    pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    google::protobuf::internal::ArenaStringPtr::Set(&this->docstring_,psVar3,pAVar5);
  }
  bVar1 = _internal_has_type(from);
  if (bVar1) {
    this_00 = (ValueType *)operator_new(0x20);
    ValueType::ValueType(this_00,from->type_);
    this->type_ = this_00;
  }
  else {
    this->type_ = (ValueType *)0x0;
  }
  clear_has_value(this);
  VVar2 = value_case(from);
  if (VVar2 != VALUE_NOT_SET) {
    if (VVar2 == kImmediateValue) {
      this_01 = _internal_mutable_immediatevalue(this);
      from_00 = _internal_immediatevalue(from);
      Value_ImmediateValue::MergeFrom(this_01,from_00);
    }
    else if (VVar2 == kBlobFileValue) {
      this_02 = _internal_mutable_blobfilevalue(this);
      from_01 = _internal_blobfilevalue(from);
      Value_BlobFileValue::MergeFrom(this_02,from_01);
    }
  }
  return;
}

Assistant:

Value::Value(const Value& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  docstring_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  #ifdef PROTOBUF_FORCE_COPY_DEFAULT_STRING
    docstring_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), "", GetArenaForAllocation());
  #endif // PROTOBUF_FORCE_COPY_DEFAULT_STRING
  if (!from._internal_docstring().empty()) {
    docstring_.Set(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, from._internal_docstring(), 
      GetArenaForAllocation());
  }
  if (from._internal_has_type()) {
    type_ = new ::CoreML::Specification::MILSpec::ValueType(*from.type_);
  } else {
    type_ = nullptr;
  }
  clear_has_value();
  switch (from.value_case()) {
    case kImmediateValue: {
      _internal_mutable_immediatevalue()->::CoreML::Specification::MILSpec::Value_ImmediateValue::MergeFrom(from._internal_immediatevalue());
      break;
    }
    case kBlobFileValue: {
      _internal_mutable_blobfilevalue()->::CoreML::Specification::MILSpec::Value_BlobFileValue::MergeFrom(from._internal_blobfilevalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.Value)
}